

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O0

void Gia_ManTerAnalyze2(Vec_Ptr_t *vStates,int nRegs)

{
  int iVar1;
  int iVar2;
  uint *pInfo;
  void *pvVar3;
  uint local_38;
  int nStateWords;
  int nConsts;
  int nZeros;
  int w;
  int i;
  uint *pStates;
  uint *pTemp;
  int nRegs_local;
  Vec_Ptr_t *vStates_local;
  
  pInfo = (uint *)Vec_PtrPop(vStates);
  iVar1 = Abc_BitWordNum(nRegs << 1);
  memset(pInfo,0,(long)iVar1 << 2);
  for (nZeros = 0; iVar2 = Vec_PtrSize(vStates), nZeros < iVar2; nZeros = nZeros + 1) {
    pvVar3 = Vec_PtrEntry(vStates,nZeros);
    for (nConsts = 0; nConsts < iVar1; nConsts = nConsts + 1) {
      pInfo[nConsts] = *(uint *)((long)pvVar3 + (long)nConsts * 4) | pInfo[nConsts];
    }
  }
  for (nZeros = 0; nZeros < nRegs; nZeros = nZeros + 1) {
    Gia_ManTerSimInfoGet(pInfo,nZeros);
  }
  printf("Found %d constant registers.\n");
  memset(pInfo,0,(long)iVar1 << 2);
  for (nZeros = 0; iVar2 = Vec_PtrSize(vStates), nZeros < iVar2; nZeros = nZeros + 1) {
    pvVar3 = Vec_PtrEntry(vStates,nZeros);
    for (nConsts = 0; nConsts < iVar1; nConsts = nConsts + 1) {
      pInfo[nConsts] =
           (*(uint *)((long)pvVar3 + (long)nConsts * 4) ^
            *(uint *)((long)pvVar3 + (long)nConsts * 4) >> 1 ^ 0xffffffff) & 0x55555555 |
           pInfo[nConsts];
    }
  }
  local_38 = 0;
  for (nZeros = 0; nZeros < nRegs; nZeros = nZeros + 1) {
    iVar1 = Gia_ManTerSimInfoGet(pInfo,nZeros);
    if (iVar1 == 0) {
      local_38 = local_38 + 1;
    }
  }
  printf("Found %d non-ternary registers.\n",(ulong)local_38);
  Vec_PtrPush(vStates,pInfo);
  return;
}

Assistant:

void Gia_ManTerAnalyze2( Vec_Ptr_t * vStates, int nRegs )
{
    unsigned * pTemp, * pStates = (unsigned *)Vec_PtrPop( vStates );
    int i, w, nZeros, nConsts, nStateWords;
    // detect constant zero registers
    nStateWords = Abc_BitWordNum( 2*nRegs );
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= pTemp[w];
    // count the number of zeros
    nZeros = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == GIA_ZER )
            nZeros++;
    printf( "Found %d constant registers.\n", nZeros );
    // detect non-ternary registers
    memset( pStates, 0, sizeof(int) * nStateWords );
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        for ( w = 0; w < nStateWords; w++ )
            pStates[w] |= (~(pTemp[w] ^ (pTemp[w] >> 1)) & 0x55555555);
    // count the nonternary registers
    nConsts = 0;
    for ( i = 0; i < nRegs; i++ )
        if ( Gia_ManTerSimInfoGet(pStates, i) == 0 )
            nConsts++;
    printf( "Found %d non-ternary registers.\n", nConsts );
    // return the state back
    Vec_PtrPush( vStates, pStates );
}